

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_AddTxIn_RemoveTxIn_Test::TestBody(Transaction_AddTxIn_RemoveTxIn_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  undefined4 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  Transaction tx;
  Script script;
  Txid local_1f0;
  AssertHelper local_1d0;
  AssertHelper local_1c8 [2];
  undefined1 local_1b8 [16];
  Txid local_1a8 [2];
  Script local_168;
  AbstractTxInReference local_130;
  AbstractTxInReference local_a0;
  
  cfd::core::Transaction::Transaction((Transaction *)(local_1b8 + 0x10),2,0);
  ppuVar1 = (pointer *)
            ((long)&local_1f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_1f0._vptr_Txid = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"1600141c673dd706e05b17e5c9ff033c8619d06098d7ac","");
  cfd::core::Script::Script(&local_168,(string *)&local_1f0);
  if (local_1f0._vptr_Txid != (_func_int **)ppuVar1) {
    operator_delete(local_1f0._vptr_Txid);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1c8[0].data_ = (AssertHelperData *)local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,
                 "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9","");
      cfd::core::Txid::Txid(&local_1f0,(string *)local_1c8);
      cfd::core::Transaction::AddTxIn
                ((Txid *)(local_1b8 + 0x10),(uint)&local_1f0,1,(Script *)0xfffffffe);
      local_1f0._vptr_Txid = (_func_int **)&PTR__Txid_004deb78;
      if (local_1f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1c8[0].data_ != (AssertHelperData *)local_1b8) {
        operator_delete(local_1c8[0].data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x10e,
               "Expected: tx.AddTxIn( Txid( \"306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9\"), 1, 4294967294, script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_1c8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    if (local_1f0._vptr_Txid != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_1f0._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_1f0._vptr_Txid + 8))();
      }
      local_1f0._vptr_Txid = (_func_int **)0x0;
    }
  }
  uVar3 = cfd::core::Transaction::GetTxInCount();
  local_1c8[0].data_._0_4_ = uVar3;
  local_1d0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1f0,"tx.GetTxInCount()","1",(uint *)local_1c8,(int *)&local_1d0);
  if ((char)local_1f0._vptr_Txid == '\0') {
    testing::Message::Message((Message *)local_1c8);
    if (local_1f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1f0.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x10f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c8[0].data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_1c8[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1c8[0].data_ + 8))();
      }
      local_1c8[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::GetTxIn((uint)&local_a0);
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_a0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x110,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(local_1c8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    if (local_1f0._vptr_Txid != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_1f0._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_1f0._vptr_Txid + 8))();
      }
      local_1f0._vptr_Txid = (_func_int **)0x0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::RemoveTxIn((int)local_1b8 + 0x10);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x112,
               "Expected: tx.RemoveTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(local_1c8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    if (local_1f0._vptr_Txid != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_1f0._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_1f0._vptr_Txid + 8))();
      }
      local_1f0._vptr_Txid = (_func_int **)0x0;
    }
  }
  uVar3 = cfd::core::Transaction::GetTxInCount();
  local_1c8[0].data_._0_4_ = uVar3;
  local_1d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1f0,"tx.GetTxInCount()","0",(uint *)local_1c8,(int *)&local_1d0);
  if ((char)local_1f0._vptr_Txid == '\0') {
    testing::Message::Message((Message *)local_1c8);
    if (local_1f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1f0.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x113,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c8[0].data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_1c8[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1c8[0].data_ + 8))();
      }
      local_1c8[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Transaction::GetTxIn((uint)&local_130);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_130);
  }
  testing::Message::Message((Message *)&local_1f0);
  testing::internal::AssertHelper::AssertHelper
            (local_1c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x114,
             "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_1c8,(Message *)&local_1f0);
  testing::internal::AssertHelper::~AssertHelper(local_1c8);
  if (local_1f0._vptr_Txid != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_1f0._vptr_Txid != (_func_int **)0x0)) {
      (**(code **)(*local_1f0._vptr_Txid + 8))();
    }
    local_1f0._vptr_Txid = (_func_int **)0x0;
  }
  cfd::core::Script::~Script(&local_168);
  cfd::core::Transaction::~Transaction((Transaction *)(local_1b8 + 0x10));
  return;
}

Assistant:

TEST(Transaction, AddTxIn_RemoveTxIn) {
  Transaction tx(exp_version, exp_locktime);

  Script script("1600141c673dd706e05b17e5c9ff033c8619d06098d7ac");
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9"),
          1, 4294967294, script));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  EXPECT_NO_THROW(tx.GetTxIn(0));

  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  EXPECT_EQ(tx.GetTxInCount(), 0);
  EXPECT_THROW(tx.GetTxIn(0), CfdException);
}